

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

int VP8LGetHistoImageSymbols
              (int xsize,int ysize,VP8LBackwardRefs *refs,int quality,int low_effort,
              int histogram_bits,int cache_bits,VP8LHistogramSet *image_histo,
              VP8LHistogram *tmp_histo,uint32_t *histogram_symbols,WebPPicture *pic,
              int percent_range,int *percent)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  int iVar5;
  VP8LHistogramSet *pVVar6;
  VP8LHistogramSet *bin_map_00;
  int64_t iVar7;
  int in_ECX;
  uint32_t in_ESI;
  uint32_t in_EDI;
  int in_R8D;
  uint32_t in_R9D;
  VP8LHistogramSet *in_stack_00000010;
  int in_stack_0000001c;
  int *in_stack_00000020;
  WebPPicture *in_stack_00000028;
  int do_greedy;
  int threshold_size;
  uint32_t num_clusters;
  int32_t combine_cost_factor;
  uint16_t *bin_map;
  int num_used;
  uint16_t *cluster_mappings;
  uint16_t *map_tmp;
  int entropy_combine;
  int entropy_combine_num_bins;
  VP8LHistogramSet *orig_histo;
  int image_histo_raw_size;
  int histo_ysize;
  int histo_xsize;
  undefined4 in_stack_000000cc;
  int in_stack_000000e0;
  int32_t in_stack_000000e8;
  int in_stack_000000f0;
  int in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  uint32_t *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  uint uVar8;
  uint32_t num_clusters_00;
  int in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int32_t in_stack_ffffffffffffffa4;
  VP8LBackwardRefs *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  int iVar9;
  VP8LHistogramSet *out;
  
  if (in_R9D == 0) {
    num_clusters_00 = 1;
    uVar3 = 1;
    uVar2 = num_clusters_00;
  }
  else {
    uVar2 = VP8LSubSampleSize(in_EDI,in_R9D);
    num_clusters_00 = uVar2;
    uVar3 = VP8LSubSampleSize(in_ESI,in_R9D);
  }
  iVar4 = uVar2 * uVar3;
  pVVar6 = VP8LAllocateHistogramSet(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
  iVar5 = 0x40;
  if (in_R8D != 0) {
    iVar5 = 4;
  }
  bin_map_00 = (VP8LHistogramSet *)
               WebPSafeMalloc(CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                              CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  out = (VP8LHistogramSet *)((long)&bin_map_00->size + (long)iVar4 * 2);
  if ((pVVar6 == (VP8LHistogramSet *)0x0) || (bin_map_00 == (VP8LHistogramSet *)0x0)) {
    WebPEncodingSetError(in_stack_00000028,VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  else {
    iVar9 = iVar4;
    HistogramBuild(iVar4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                   (VP8LHistogramSet *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                  );
    HistogramCopyAndAnalyze
              ((VP8LHistogramSet *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (VP8LHistogramSet *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               (int *)CONCAT44(num_clusters_00,uVar3),
               (uint32_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    uVar8 = in_stack_ffffffffffffff8c & 0xffffff;
    if (iVar9 != iVar5 * 2 && SBORROW4(iVar9,iVar5 * 2) == iVar9 + iVar5 * -2 < 0) {
      uVar8 = CONCAT13(in_ECX < 100,(int3)in_stack_ffffffffffffff8c);
    }
    uVar1 = uVar8 >> 0x18;
    pVVar6 = bin_map_00;
    if (uVar1 != 0) {
      in_stack_ffffffffffffffa0 = iVar9;
      in_stack_ffffffffffffffa4 = GetCombineCostFactor(iVar4,in_ECX);
      iVar9 = in_stack_ffffffffffffffa0;
      HistogramAnalyzeEntropyBin
                ((VP8LHistogramSet *)CONCAT44(in_stack_ffffffffffffffa0,in_stack_ffffffffffffffb0),
                 (uint16_t *)bin_map_00,in_stack_ffffffffffffffa4);
      in_stack_ffffffffffffff78 = in_R8D;
      HistogramCombineEntropyBin
                ((VP8LHistogramSet *)percent,(int *)CONCAT44(in_stack_000000cc,percent_range),
                 (uint32_t *)pic,(uint16_t *)histogram_symbols,tmp_histo,(uint16_t *)image_histo,
                 in_stack_000000e0,in_stack_000000e8,in_stack_000000f0);
      OptimizeHistogramSymbols
                ((VP8LHistogramSet *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (uint16_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 num_clusters_00,(uint16_t *)CONCAT44(uVar8,in_stack_ffffffffffffff88),
                 in_stack_ffffffffffffff80);
      in_stack_ffffffffffffff68 = iVar5;
    }
    if ((in_R8D == 0) || (uVar1 == 0)) {
      iVar7 = DivRound((long)(in_ECX * in_ECX * in_ECX * 99),1000000);
      iVar4 = (int)iVar7 + 1;
      iVar5 = HistogramCombineStochastic
                        ((VP8LHistogramSet *)in_stack_00000028,in_stack_00000020,in_stack_0000001c,
                         &in_stack_00000010->size);
      if (iVar5 == 0) {
        WebPEncodingSetError(in_stack_00000028,VP8_ENC_ERROR_OUT_OF_MEMORY);
        goto LAB_001c6037;
      }
      if (in_stack_ffffffffffffff98 != 0) {
        RemoveEmptyHistograms(in_stack_00000010);
        iVar4 = HistogramCombineGreedy
                          ((VP8LHistogramSet *)
                           CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           (int *)CONCAT44(iVar4,in_stack_ffffffffffffff98));
        if (iVar4 == 0) {
          WebPEncodingSetError(in_stack_00000028,VP8_ENC_ERROR_OUT_OF_MEMORY);
          goto LAB_001c6037;
        }
      }
    }
    RemoveEmptyHistograms(in_stack_00000010);
    HistogramRemap(pVVar6,out,(uint32_t *)CONCAT44(iVar9,in_stack_ffffffffffffffb0));
    WebPReportProgress((WebPPicture *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                       in_stack_ffffffffffffff74,
                       (int *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  }
LAB_001c6037:
  VP8LFreeHistogramSet((VP8LHistogramSet *)0x1c6041);
  WebPSafeFree((void *)0x1c604b);
  return (int)(in_stack_00000028->error_code == VP8_ENC_OK);
}

Assistant:

int VP8LGetHistoImageSymbols(int xsize, int ysize,
                             const VP8LBackwardRefs* const refs, int quality,
                             int low_effort, int histogram_bits, int cache_bits,
                             VP8LHistogramSet* const image_histo,
                             VP8LHistogram* const tmp_histo,
                             uint32_t* const histogram_symbols,
                             const WebPPicture* const pic, int percent_range,
                             int* const percent) {
  const int histo_xsize =
      histogram_bits ? VP8LSubSampleSize(xsize, histogram_bits) : 1;
  const int histo_ysize =
      histogram_bits ? VP8LSubSampleSize(ysize, histogram_bits) : 1;
  const int image_histo_raw_size = histo_xsize * histo_ysize;
  VP8LHistogramSet* const orig_histo =
      VP8LAllocateHistogramSet(image_histo_raw_size, cache_bits);
  // Don't attempt linear bin-partition heuristic for
  // histograms of small sizes (as bin_map will be very sparse) and
  // maximum quality q==100 (to preserve the compression gains at that level).
  const int entropy_combine_num_bins = low_effort ? NUM_PARTITIONS : BIN_SIZE;
  int entropy_combine;
  uint16_t* const map_tmp =
      (uint16_t*)WebPSafeMalloc(2 * image_histo_raw_size, sizeof(*map_tmp));
  uint16_t* const cluster_mappings = map_tmp + image_histo_raw_size;
  int num_used = image_histo_raw_size;
  if (orig_histo == NULL || map_tmp == NULL) {
    WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  // Construct the histograms from backward references.
  HistogramBuild(xsize, histogram_bits, refs, orig_histo);
  // Copies the histograms and computes its bit_cost.
  // histogram_symbols is optimized
  HistogramCopyAndAnalyze(orig_histo, image_histo, &num_used,
                          histogram_symbols);

  entropy_combine =
      (num_used > entropy_combine_num_bins * 2) && (quality < 100);

  if (entropy_combine) {
    uint16_t* const bin_map = map_tmp;
    const int32_t combine_cost_factor =
        GetCombineCostFactor(image_histo_raw_size, quality);
    const uint32_t num_clusters = num_used;

    HistogramAnalyzeEntropyBin(image_histo, bin_map, low_effort);
    // Collapse histograms with similar entropy.
    HistogramCombineEntropyBin(
        image_histo, &num_used, histogram_symbols, cluster_mappings, tmp_histo,
        bin_map, entropy_combine_num_bins, combine_cost_factor, low_effort);
    OptimizeHistogramSymbols(image_histo, cluster_mappings, num_clusters,
                             map_tmp, histogram_symbols);
  }

  // Don't combine the histograms using stochastic and greedy heuristics for
  // low-effort compression mode.
  if (!low_effort || !entropy_combine) {
    // cubic ramp between 1 and MAX_HISTO_GREEDY:
    const int threshold_size =
        (int)(1 + DivRound(quality * quality * quality * (MAX_HISTO_GREEDY - 1),
                           100 * 100 * 100));
    int do_greedy;
    if (!HistogramCombineStochastic(image_histo, &num_used, threshold_size,
                                    &do_greedy)) {
      WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
      goto Error;
    }
    if (do_greedy) {
      RemoveEmptyHistograms(image_histo);
      if (!HistogramCombineGreedy(image_histo, &num_used)) {
        WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
        goto Error;
      }
    }
  }

  // Find the optimal map from original histograms to the final ones.
  RemoveEmptyHistograms(image_histo);
  HistogramRemap(orig_histo, image_histo, histogram_symbols);

  if (!WebPReportProgress(pic, *percent + percent_range, percent)) {
    goto Error;
  }

 Error:
  VP8LFreeHistogramSet(orig_histo);
  WebPSafeFree(map_tmp);
  return (pic->error_code == VP8_ENC_OK);
}